

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O0

void __thiscall
icu_63::UnicodeString::UnicodeString
          (UnicodeString *this,char *src,int32_t length,EInvariant param_3)

{
  UBool UVar1;
  size_t sVar2;
  char16_t *us;
  int32_t local_1c;
  EInvariant param_3_local;
  int32_t length_local;
  char *src_local;
  UnicodeString *this_local;
  
  Replaceable::Replaceable(&this->super_Replaceable);
  (this->super_Replaceable).super_UObject._vptr_UObject = (_func_int **)&PTR__UnicodeString_002bc130
  ;
  (this->fUnion).fStackFields.fLengthAndFlags = 2;
  if (src != (char *)0x0) {
    local_1c = length;
    if (length < 0) {
      sVar2 = strlen(src);
      local_1c = (int32_t)sVar2;
    }
    UVar1 = cloneArrayIfNeeded(this,local_1c,local_1c,'\0',(int32_t **)0x0,'\0');
    if (UVar1 == '\0') {
      setToBogus(this);
    }
    else {
      us = getArrayStart(this);
      u_charsToUChars_63(src,us,local_1c);
      setLength(this,local_1c);
    }
  }
  return;
}

Assistant:

UnicodeString::UnicodeString(const char *src, int32_t length, EInvariant) {
  fUnion.fFields.fLengthAndFlags = kShortString;
  if(src==NULL) {
    // treat as an empty string
  } else {
    if(length<0) {
      length=(int32_t)uprv_strlen(src);
    }
    if(cloneArrayIfNeeded(length, length, FALSE)) {
      u_charsToUChars(src, getArrayStart(), length);
      setLength(length);
    } else {
      setToBogus();
    }
  }
}